

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es3fFboStencilbufferTests.cpp
# Opt level: O0

void __thiscall
deqp::gles3::Functional::BasicFboStencilCase::render(BasicFboStencilCase *this,Surface *dst)

{
  int iVar1;
  deUint32 dVar2;
  int height;
  Context *pCVar3;
  int *piVar4;
  float *value;
  Vector<float,_4> local_3d8;
  Vector<float,_4> local_3c8;
  TextureFormat local_3b8;
  Vector<float,_3> local_3b0;
  Vector<float,_3> local_3a4;
  Vector<float,_4> local_398;
  Vector<float,_3> local_388;
  Vector<float,_3> local_37c;
  Vector<float,_4> local_370;
  Vector<float,_3> local_360;
  Vector<float,_3> local_354;
  Vector<float,_4> local_348;
  Vector<float,_4> local_338;
  Vector<float,_3> local_328;
  Vector<float,_3> local_31c;
  Vector<float,_4> local_310;
  Vector<float,_4> local_300;
  deUint32 local_2f0;
  deUint32 local_2ec;
  deUint32 depthStencilRbo;
  deUint32 colorRbo;
  deUint32 fbo;
  deUint32 gradShaderID;
  deUint32 flatShaderID;
  undefined1 local_2d0 [8];
  FlatColorShader flatShader;
  GradientShader gradShader;
  deUint32 colorFormat;
  Surface *dst_local;
  BasicFboStencilCase *this_local;
  
  FboTestUtil::GradientShader::GradientShader
            ((GradientShader *)&flatShader.super_ShaderProgram.m_hasGeometryShader,TYPE_FLOAT_VEC4);
  FboTestUtil::FlatColorShader::FlatColorShader((FlatColorShader *)local_2d0,TYPE_FLOAT_VEC4);
  pCVar3 = sglr::ContextWrapper::getCurrentContext(&(this->super_FboTestCase).super_ContextWrapper);
  fbo = (*pCVar3->_vptr_Context[0x75])(pCVar3,local_2d0);
  pCVar3 = sglr::ContextWrapper::getCurrentContext(&(this->super_FboTestCase).super_ContextWrapper);
  colorRbo = (*pCVar3->_vptr_Context[0x75])
                       (pCVar3,&flatShader.super_ShaderProgram.m_hasGeometryShader);
  depthStencilRbo = 0;
  local_2ec = 0;
  local_2f0 = 0;
  sglr::ContextWrapper::glGenRenderbuffers
            (&(this->super_FboTestCase).super_ContextWrapper,1,&local_2ec);
  sglr::ContextWrapper::glBindRenderbuffer
            (&(this->super_FboTestCase).super_ContextWrapper,0x8d41,local_2ec);
  piVar4 = tcu::Vector<int,_2>::x(&this->m_size);
  iVar1 = *piVar4;
  piVar4 = tcu::Vector<int,_2>::y(&this->m_size);
  sglr::ContextWrapper::glRenderbufferStorage
            (&(this->super_FboTestCase).super_ContextWrapper,0x8d41,0x8058,iVar1,*piVar4);
  sglr::ContextWrapper::glGenRenderbuffers
            (&(this->super_FboTestCase).super_ContextWrapper,1,&local_2f0);
  sglr::ContextWrapper::glBindRenderbuffer
            (&(this->super_FboTestCase).super_ContextWrapper,0x8d41,local_2f0);
  dVar2 = this->m_format;
  piVar4 = tcu::Vector<int,_2>::x(&this->m_size);
  iVar1 = *piVar4;
  piVar4 = tcu::Vector<int,_2>::y(&this->m_size);
  sglr::ContextWrapper::glRenderbufferStorage
            (&(this->super_FboTestCase).super_ContextWrapper,0x8d41,dVar2,iVar1,*piVar4);
  sglr::ContextWrapper::glGenFramebuffers
            (&(this->super_FboTestCase).super_ContextWrapper,1,&depthStencilRbo);
  sglr::ContextWrapper::glBindFramebuffer
            (&(this->super_FboTestCase).super_ContextWrapper,0x8d40,depthStencilRbo);
  sglr::ContextWrapper::glFramebufferRenderbuffer
            (&(this->super_FboTestCase).super_ContextWrapper,0x8d40,0x8ce0,0x8d41,local_2ec);
  sglr::ContextWrapper::glFramebufferRenderbuffer
            (&(this->super_FboTestCase).super_ContextWrapper,0x8d40,0x8d20,0x8d41,local_2f0);
  if ((this->m_useDepth & 1U) != 0) {
    sglr::ContextWrapper::glFramebufferRenderbuffer
              (&(this->super_FboTestCase).super_ContextWrapper,0x8d40,0x8d00,0x8d41,local_2f0);
  }
  FboTestCase::checkError(&this->super_FboTestCase);
  FboTestCase::checkFramebufferStatus(&this->super_FboTestCase,0x8d40);
  piVar4 = tcu::Vector<int,_2>::x(&this->m_size);
  iVar1 = *piVar4;
  piVar4 = tcu::Vector<int,_2>::y(&this->m_size);
  sglr::ContextWrapper::glViewport
            (&(this->super_FboTestCase).super_ContextWrapper,0,0,iVar1,*piVar4);
  tcu::Vector<float,_4>::Vector(&local_300,0.0);
  value = tcu::Vector<float,_4>::getPtr(&local_300);
  sglr::ContextWrapper::glClearBufferfv
            (&(this->super_FboTestCase).super_ContextWrapper,0x1800,0,value);
  sglr::ContextWrapper::glClearBufferfi
            (&(this->super_FboTestCase).super_ContextWrapper,0x84f9,0,1.0,0);
  sglr::ContextWrapper::glEnable(&(this->super_FboTestCase).super_ContextWrapper,0xb71);
  sglr::ContextWrapper::glEnable(&(this->super_FboTestCase).super_ContextWrapper,0xb90);
  sglr::ContextWrapper::glStencilFunc(&(this->super_FboTestCase).super_ContextWrapper,0x207,0,0xff);
  sglr::ContextWrapper::glStencilOp
            (&(this->super_FboTestCase).super_ContextWrapper,0x1e00,0x1e00,0x1e02);
  pCVar3 = sglr::ContextWrapper::getCurrentContext(&(this->super_FboTestCase).super_ContextWrapper);
  dVar2 = fbo;
  tcu::Vector<float,_4>::Vector(&local_310,1.0,0.0,0.0,1.0);
  FboTestUtil::FlatColorShader::setColor((FlatColorShader *)local_2d0,pCVar3,dVar2,&local_310);
  pCVar3 = sglr::ContextWrapper::getCurrentContext(&(this->super_FboTestCase).super_ContextWrapper);
  dVar2 = fbo;
  tcu::Vector<float,_3>::Vector(&local_31c,-1.0,-1.0,0.0);
  tcu::Vector<float,_3>::Vector(&local_328,1.0,1.0,0.0);
  sglr::drawQuad(pCVar3,dVar2,&local_31c,&local_328);
  pCVar3 = sglr::ContextWrapper::getCurrentContext(&(this->super_FboTestCase).super_ContextWrapper);
  dVar2 = colorRbo;
  tcu::Vector<float,_4>::Vector(&local_338,0.0);
  tcu::Vector<float,_4>::Vector(&local_348,1.0);
  FboTestUtil::GradientShader::setGradient
            ((GradientShader *)&flatShader.super_ShaderProgram.m_hasGeometryShader,pCVar3,dVar2,
             &local_338,&local_348);
  pCVar3 = sglr::ContextWrapper::getCurrentContext(&(this->super_FboTestCase).super_ContextWrapper);
  dVar2 = colorRbo;
  tcu::Vector<float,_3>::Vector(&local_354,-1.0,-1.0,-1.0);
  tcu::Vector<float,_3>::Vector(&local_360,1.0,1.0,1.0);
  sglr::drawQuad(pCVar3,dVar2,&local_354,&local_360);
  sglr::ContextWrapper::glDisable(&(this->super_FboTestCase).super_ContextWrapper,0xb71);
  sglr::ContextWrapper::glStencilFunc
            (&(this->super_FboTestCase).super_ContextWrapper,0x202,(this->m_useDepth & 1) + 1,0xff);
  sglr::ContextWrapper::glStencilOp
            (&(this->super_FboTestCase).super_ContextWrapper,0x1e03,0x1e00,0x1e00);
  pCVar3 = sglr::ContextWrapper::getCurrentContext(&(this->super_FboTestCase).super_ContextWrapper);
  dVar2 = fbo;
  tcu::Vector<float,_4>::Vector(&local_370,0.0,1.0,0.0,1.0);
  FboTestUtil::FlatColorShader::setColor((FlatColorShader *)local_2d0,pCVar3,dVar2,&local_370);
  pCVar3 = sglr::ContextWrapper::getCurrentContext(&(this->super_FboTestCase).super_ContextWrapper);
  dVar2 = fbo;
  tcu::Vector<float,_3>::Vector(&local_37c,-0.5,-0.5,0.0);
  tcu::Vector<float,_3>::Vector(&local_388,0.5,0.5,0.0);
  sglr::drawQuad(pCVar3,dVar2,&local_37c,&local_388);
  sglr::ContextWrapper::glStencilFunc
            (&(this->super_FboTestCase).super_ContextWrapper,0x204,2 - (this->m_useDepth & 1),0xff);
  pCVar3 = sglr::ContextWrapper::getCurrentContext(&(this->super_FboTestCase).super_ContextWrapper);
  dVar2 = fbo;
  tcu::Vector<float,_4>::Vector(&local_398,0.0,0.0,1.0,1.0);
  FboTestUtil::FlatColorShader::setColor((FlatColorShader *)local_2d0,pCVar3,dVar2,&local_398);
  pCVar3 = sglr::ContextWrapper::getCurrentContext(&(this->super_FboTestCase).super_ContextWrapper);
  dVar2 = fbo;
  tcu::Vector<float,_3>::Vector(&local_3a4,-1.0,-1.0,0.0);
  tcu::Vector<float,_3>::Vector(&local_3b0,1.0,1.0,0.0);
  sglr::drawQuad(pCVar3,dVar2,&local_3a4,&local_3b0);
  piVar4 = tcu::Vector<int,_2>::x(&this->m_size);
  iVar1 = *piVar4;
  piVar4 = tcu::Vector<int,_2>::y(&this->m_size);
  height = *piVar4;
  local_3b8 = glu::mapGLInternalFormat(0x8058);
  tcu::Vector<float,_4>::Vector(&local_3c8,1.0);
  tcu::Vector<float,_4>::Vector(&local_3d8,0.0);
  FboTestCase::readPixels
            (&this->super_FboTestCase,dst,0,0,iVar1,height,&local_3b8,&local_3c8,&local_3d8);
  FboTestUtil::FlatColorShader::~FlatColorShader((FlatColorShader *)local_2d0);
  FboTestUtil::GradientShader::~GradientShader
            ((GradientShader *)&flatShader.super_ShaderProgram.m_hasGeometryShader);
  return;
}

Assistant:

void render (tcu::Surface& dst)
	{
		const deUint32			colorFormat		= GL_RGBA8;

		GradientShader			gradShader		(glu::TYPE_FLOAT_VEC4);
		FlatColorShader			flatShader		(glu::TYPE_FLOAT_VEC4);
		deUint32				flatShaderID	= getCurrentContext()->createProgram(&flatShader);
		deUint32				gradShaderID	= getCurrentContext()->createProgram(&gradShader);

		deUint32				fbo				= 0;
		deUint32				colorRbo		= 0;
		deUint32				depthStencilRbo	= 0;

		// Colorbuffer.
		glGenRenderbuffers(1, &colorRbo);
		glBindRenderbuffer(GL_RENDERBUFFER, colorRbo);
		glRenderbufferStorage(GL_RENDERBUFFER, colorFormat, m_size.x(), m_size.y());

		// Stencil (and depth) buffer.
		glGenRenderbuffers(1, &depthStencilRbo);
		glBindRenderbuffer(GL_RENDERBUFFER, depthStencilRbo);
		glRenderbufferStorage(GL_RENDERBUFFER, m_format, m_size.x(), m_size.y());

		// Framebuffer.
		glGenFramebuffers(1, &fbo);
		glBindFramebuffer(GL_FRAMEBUFFER, fbo);
		glFramebufferRenderbuffer(GL_FRAMEBUFFER, GL_COLOR_ATTACHMENT0, GL_RENDERBUFFER, colorRbo);
		glFramebufferRenderbuffer(GL_FRAMEBUFFER, GL_STENCIL_ATTACHMENT, GL_RENDERBUFFER, depthStencilRbo);
		if (m_useDepth)
			glFramebufferRenderbuffer(GL_FRAMEBUFFER, GL_DEPTH_ATTACHMENT, GL_RENDERBUFFER, depthStencilRbo);
		checkError();
		checkFramebufferStatus(GL_FRAMEBUFFER);

		glViewport(0, 0, m_size.x(), m_size.y());

		// Clear framebuffer.
		glClearBufferfv(GL_COLOR, 0, Vec4(0.0f).getPtr());
		glClearBufferfi(GL_DEPTH_STENCIL, 0, 1.0f, 0);

		// Render intersecting quads - increment stencil on depth pass
		glEnable(GL_DEPTH_TEST);
		glEnable(GL_STENCIL_TEST);
		glStencilFunc(GL_ALWAYS, 0, 0xffu);
		glStencilOp(GL_KEEP, GL_KEEP, GL_INCR);

		flatShader.setColor(*getCurrentContext(), flatShaderID, Vec4(1.0f, 0.0f, 0.0f, 1.0f));
		sglr::drawQuad(*getCurrentContext(), flatShaderID, Vec3(-1.0f, -1.0f,  0.0f), Vec3(+1.0f, +1.0f,  0.0f));

		gradShader.setGradient(*getCurrentContext(), gradShaderID, Vec4(0.0f), Vec4(1.0f));
		sglr::drawQuad(*getCurrentContext(), gradShaderID, Vec3(-1.0f, -1.0f, -1.0f), Vec3(+1.0f, +1.0f, +1.0f));

		glDisable(GL_DEPTH_TEST);

		// Draw quad with stencil test (stencil == 1 or 2 depending on depth) - decrement on stencil failure
		glStencilFunc(GL_EQUAL, m_useDepth ? 2 : 1, 0xffu);
		glStencilOp(GL_DECR, GL_KEEP, GL_KEEP);

		flatShader.setColor(*getCurrentContext(), flatShaderID, Vec4(0.0f, 1.0f, 0.0f, 1.0));
		sglr::drawQuad(*getCurrentContext(), flatShaderID, Vec3(-0.5f, -0.5f, 0.0f), Vec3(+0.5f, +0.5f, 0.0f));

		// Draw quad with stencil test where stencil > 1 or 2 depending on depth buffer
		glStencilFunc(GL_GREATER, m_useDepth ? 1 : 2, 0xffu);

		flatShader.setColor(*getCurrentContext(), flatShaderID, Vec4(0.0f, 0.0f, 1.0f, 1.0f));
		sglr::drawQuad(*getCurrentContext(), flatShaderID, Vec3(-1.0f, -1.0f, 0.0f), Vec3(+1.0f, +1.0f, 0.0f));

		readPixels(dst, 0, 0, m_size.x(), m_size.y(), glu::mapGLInternalFormat(colorFormat), Vec4(1.0f), Vec4(0.0f));
	}